

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O2

dlep_parser_value * dlep_session_get_tlv_value(dlep_session *session,uint16_t tlvtype)

{
  long lVar1;
  undefined8 uVar2;
  dlep_parser_value *pdVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *pcVar6;
  
  lVar1 = avl_find(&session->parser);
  if (lVar1 == 0) {
    uVar4 = (ulong)session->log_source;
    if (((&log_global_mask)[uVar4] & 2) == 0) {
      return (dlep_parser_value *)0x0;
    }
    pcVar6 = "Could not find TLV type %u";
    pdVar3 = (dlep_parser_value *)0x0;
    uVar5 = 2;
    uVar2 = 0x2a2;
  }
  else if (((long)*(int *)(lVar1 + -0x14) == -1) ||
          (pdVar3 = (session->parser).values, pdVar3 == (dlep_parser_value *)0x0)) {
    uVar4 = (ulong)session->log_source;
    if (((&log_global_mask)[uVar4] & 2) == 0) {
      return (dlep_parser_value *)0x0;
    }
    pcVar6 = "Could not find value of TLV type %u";
    pdVar3 = (dlep_parser_value *)0x0;
    uVar5 = 2;
    uVar2 = 0x2a8;
  }
  else {
    pdVar3 = pdVar3 + *(int *)(lVar1 + -0x14);
    uVar4 = (ulong)session->log_source;
    if (((&log_global_mask)[uVar4] & 1) == 0) {
      return pdVar3;
    }
    pcVar6 = "TLV %u has value";
    uVar5 = 1;
    uVar2 = 0x2ac;
  }
  oonf_log(uVar5,uVar4,"src/generic/dlep/dlep_session.c",uVar2,0,0,pcVar6,tlvtype);
  return pdVar3;
}

Assistant:

struct dlep_parser_value *
dlep_session_get_tlv_value(struct dlep_session *session, uint16_t tlvtype) {
  struct dlep_parser_tlv *tlv;
  struct dlep_parser_value *value;

  tlv = dlep_parser_get_tlv(&session->parser, tlvtype);
  if (!tlv) {
    OONF_INFO(session->log_source, "Could not find TLV type %u", tlvtype);
    return NULL;
  }

  value = dlep_session_get_tlv_first_value(session, tlv);
  if (!value) {
    OONF_INFO(session->log_source, "Could not find value of TLV type %u", tlvtype);
    return NULL;
  }
  else {
    OONF_DEBUG(session->log_source, "TLV %u has value", tlvtype);
  }
  return value;
}